

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  TestEventListener *pTVar2;
  TestResult *this_01;
  TimeInMillis TVar3;
  Test *this_02;
  long in_RDI;
  Test *test;
  Timer timer;
  TestEventListener *repeater;
  TestFactoryBase *in_stack_00000058;
  code *in_stack_ffffffffffffffc0;
  TestInfo *in_stack_ffffffffffffffc8;
  UnitTest *in_stack_ffffffffffffffd0;
  UnitTest *this_03;
  
  UnitTest::GetInstance();
  this_00 = UnitTest::listeners((UnitTest *)0x192230);
  pTVar2 = TestEventListeners::repeater(this_00);
  if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
    if (((*(byte *)(in_RDI + 0x81) & 1) != 0) && ((*(byte *)(in_RDI + 0x82) & 1) != 0)) {
      (*pTVar2->_vptr_TestEventListener[9])(pTVar2,in_RDI);
    }
  }
  else {
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    (*pTVar2->_vptr_TestEventListener[8])(pTVar2,in_RDI);
    this_01 = (TestResult *)(in_RDI + 0x90);
    TVar3 = internal::GetTimeInMillis();
    TestResult::set_start_timestamp(this_01,TVar3);
    internal::Timer::Timer((Timer *)this_01);
    UnitTest::GetInstance();
    UnitTest::UponLeavingGTest((UnitTest *)0x1922dd);
    this_03 = (UnitTest *)0x11;
    this_02 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (in_stack_00000058,(offset_in_TestFactoryBase_to_subr)repeater,
                         (char *)timer.start_.__d.__r);
    bVar1 = Test::HasFatalFailure();
    if ((!bVar1) && (bVar1 = Test::IsSkipped(), !bVar1)) {
      Test::Run(this_02);
    }
    if (this_02 != (Test *)0x0) {
      UnitTest::GetInstance();
      UnitTest::UponLeavingGTest((UnitTest *)0x192347);
      in_stack_ffffffffffffffc0 = Test::DeleteSelf_;
      in_stack_ffffffffffffffc8 = (TestInfo *)0x0;
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                ((Test *)this,(offset_in_Test_to_subr)timer.start_.__d.__r,(char *)test);
    }
    TVar3 = internal::Timer::Elapsed((Timer *)in_stack_ffffffffffffffc0);
    TestResult::set_elapsed_time((TestResult *)(in_RDI + 0x90),TVar3);
    (*pTVar2->_vptr_TestEventListener[0xb])(pTVar2,in_RDI);
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(this_03,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();
  if (!should_run_) {
    if (is_disabled_ && matches_filter_) repeater->OnTestDisabled(*this);
    return;
  }

  // Tells UnitTest where to store test result.
  UnitTest::GetInstance()->set_current_test_info(this);

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);
  result_.set_start_timestamp(internal::GetTimeInMillis());
  internal::Timer timer;
  UnitTest::GetInstance()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    UnitTest::GetInstance()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_elapsed_time(timer.Elapsed());

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  UnitTest::GetInstance()->set_current_test_info(nullptr);
}